

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall chrono::fea::ChMatterMeshless::VariablesFbReset(ChMatterMeshless *this)

{
  pointer psVar1;
  uint uVar2;
  ChVectorRef CStack_38;
  
  uVar2 = 0;
  while( true ) {
    psVar1 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)uVar2) break;
    ChVariables::Get_fb(&CStack_38,
                        &((psVar1[uVar2].
                           super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->variables).super_ChVariables);
    Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ::setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               *)&CStack_38);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void ChMatterMeshless::VariablesFbReset() {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->variables.Get_fb().setZero();
    }
}